

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall
leveldb::VersionSet::Builder::BySmallestKey::operator()
          (BySmallestKey *this,FileMetaData *f1,FileMetaData *f2)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  int r;
  InternalKey *unaff_retaddr;
  undefined1 local_1;
  
  iVar1 = InternalKeyComparator::Compare
                    ((InternalKeyComparator *)f1,(InternalKey *)f2,unaff_retaddr);
  if (iVar1 == 0) {
    local_1 = *(ulong *)(in_RSI + 8) < *(ulong *)(in_RDX + 8);
  }
  else {
    local_1 = iVar1 < 0;
  }
  return local_1;
}

Assistant:

bool operator()(FileMetaData* f1, FileMetaData* f2) const {
      int r = internal_comparator->Compare(f1->smallest, f2->smallest);
      if (r != 0) {
        return (r < 0);
      } else {
        // Break ties by file number
        return (f1->number < f2->number);
      }
    }